

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O2

void __thiscall ncnn::LSTM_x86_avx::LSTM_x86_avx(LSTM_x86_avx *this)

{
  undefined1 auVar1 [16];
  
  LSTM::LSTM(&this->super_LSTM);
  (this->super_LSTM).super_Layer._vptr_Layer = (_func_int **)&PTR__LSTM_x86_avx_0059f550;
  (this->weight_data_tm_int8_descales).cstep = 0;
  (this->super_LSTM).super_Layer.one_blob_only = false;
  (this->super_LSTM).super_Layer.support_inplace = false;
  (this->weight_xc_data_packed).data = (void *)0x0;
  (this->weight_xc_data_packed).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_xc_data_packed).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_xc_data_packed).elemsize + 4) = 0;
  (this->weight_xc_data_packed).allocator = (Allocator *)0x0;
  (this->weight_xc_data_packed).dims = 0;
  (this->weight_xc_data_packed).w = 0;
  (this->weight_xc_data_packed).w = 0;
  (this->weight_xc_data_packed).h = 0;
  (this->weight_xc_data_packed).d = 0;
  (this->weight_xc_data_packed).c = 0;
  auVar1 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])&(this->weight_xc_data_packed).cstep = ZEXT1632(auVar1);
  (this->bias_c_data_packed).elempack = 0;
  (this->bias_c_data_packed).allocator = (Allocator *)0x0;
  (this->bias_c_data_packed).dims = 0;
  (this->bias_c_data_packed).w = 0;
  (this->bias_c_data_packed).w = 0;
  (this->bias_c_data_packed).h = 0;
  (this->bias_c_data_packed).d = 0;
  (this->bias_c_data_packed).c = 0;
  (this->weight_hc_data_packed).elempack = 0;
  *(undefined1 (*) [32])&(this->bias_c_data_packed).cstep = ZEXT1632(auVar1);
  (this->weight_hc_data_packed).allocator = (Allocator *)0x0;
  (this->weight_hc_data_packed).dims = 0;
  (this->weight_hc_data_packed).w = 0;
  (this->weight_hc_data_packed).w = 0;
  (this->weight_hc_data_packed).h = 0;
  (this->weight_hc_data_packed).d = 0;
  (this->weight_hc_data_packed).c = 0;
  *(undefined1 (*) [32])&(this->weight_hc_data_packed).cstep = ZEXT1632(auVar1);
  (this->weight_data_tm).elempack = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm_int8_descales).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_tm).cstep = ZEXT1632(auVar1);
  (this->weight_data_tm_int8_descales).w = 0;
  (this->weight_data_tm_int8_descales).h = 0;
  (this->weight_data_tm_int8_descales).d = 0;
  (this->weight_data_tm_int8_descales).c = 0;
  (this->weight_data_tm_int8_descales).allocator = (Allocator *)0x0;
  (this->weight_data_tm_int8_descales).dims = 0;
  (this->weight_data_tm_int8_descales).w = 0;
  return;
}

Assistant:

LSTM_x86_avx::LSTM_x86_avx()
{
    one_blob_only = false;
    support_inplace = false;
}